

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  int iVar1;
  uint uVar2;
  Atom *pAVar3;
  undefined1 auVar4 [16];
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Atom *pAVar9;
  bool bVar10;
  
  iVar1 = this->m_atoms_size;
  uVar2 = this->m_atoms_count;
  bVar10 = true;
  if (iVar1 <= (int)uVar2) {
    iVar8 = 1;
    if (iVar1 != 0) {
      iVar8 = iVar1 * 2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar8;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar7 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
    }
    puVar5 = (ulong *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    if (puVar5 == (ulong *)0x0) {
      pAVar9 = (Atom *)0x0;
    }
    else {
      *puVar5 = (long)iVar8;
      pAVar9 = (Atom *)(puVar5 + 1);
    }
    bVar10 = pAVar9 != (Atom *)0x0;
    if (bVar10) {
      if (0 < (int)uVar2) {
        pAVar3 = this->m_atoms;
        lVar6 = 0;
        do {
          *(undefined8 *)((long)&pAVar9->m_string_uid + lVar6) =
               *(undefined8 *)((long)&pAVar3->m_string_uid + lVar6);
          *(undefined8 *)((long)&pAVar9->m_uid + lVar6) =
               *(undefined8 *)((long)&pAVar3->m_uid + lVar6);
          *(undefined8 *)((long)&pAVar9->m_start_timecode + lVar6) =
               *(undefined8 *)((long)&pAVar3->m_start_timecode + lVar6);
          *(undefined8 *)((long)&pAVar9->m_stop_timecode + lVar6) =
               *(undefined8 *)((long)&pAVar3->m_stop_timecode + lVar6);
          *(undefined8 *)((long)&pAVar9->m_displays + lVar6) =
               *(undefined8 *)((long)&pAVar3->m_displays + lVar6);
          *(undefined4 *)((long)&pAVar9->m_displays_size + lVar6) =
               *(undefined4 *)((long)&pAVar3->m_displays_size + lVar6);
          *(undefined4 *)((long)&pAVar9->m_displays_count + lVar6) =
               *(undefined4 *)((long)&pAVar3->m_displays_count + lVar6);
          lVar6 = lVar6 + 0x30;
        } while ((ulong)uVar2 * 0x30 != lVar6);
      }
      if (this->m_atoms != (Atom *)0x0) {
        operator_delete__(&this->m_atoms[-1].m_displays_size);
      }
      this->m_atoms = pAVar9;
      this->m_atoms_size = iVar8;
    }
  }
  return bVar10;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}